

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O3

void QtPrivate::
     q_relocate_overlap_n_left_move<std::reverse_iterator<VkSpecParser::TypedName*>,long_long>
               (reverse_iterator<VkSpecParser::TypedName_*> first,longlong n,
               reverse_iterator<VkSpecParser::TypedName_*> d_first)

{
  TypedName *pTVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  int *piVar5;
  TypedName *pTVar6;
  TypedName *pTVar7;
  TypedName *pTVar8;
  long in_FS_OFFSET;
  Destructor local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.end.current = (TypedName *)((d_first.current)->name).d.d;
  pTVar1 = local_38.end.current + -n;
  pTVar8 = (TypedName *)((first.current)->name).d.d;
  local_38.intermediate.current = local_38.end.current;
  pTVar6 = pTVar1;
  pTVar7 = pTVar8;
  if (pTVar1 < pTVar8) {
    pTVar6 = pTVar8;
    pTVar7 = pTVar1;
  }
  while (local_38.intermediate.current != pTVar6) {
    pDVar2 = pTVar8[-1].name.d.d;
    pTVar8[-1].name.d.d = (Data *)0x0;
    local_38.intermediate.current[-1].name.d.d = pDVar2;
    pcVar3 = pTVar8[-1].name.d.ptr;
    pTVar8[-1].name.d.ptr = (char16_t *)0x0;
    local_38.intermediate.current[-1].name.d.ptr = pcVar3;
    qVar4 = pTVar8[-1].name.d.size;
    pTVar8[-1].name.d.size = 0;
    local_38.intermediate.current[-1].name.d.size = qVar4;
    pDVar2 = pTVar8[-1].type.d.d;
    pTVar8[-1].type.d.d = (Data *)0x0;
    local_38.intermediate.current[-1].type.d.d = pDVar2;
    pcVar3 = pTVar8[-1].type.d.ptr;
    pTVar8[-1].type.d.ptr = (char16_t *)0x0;
    local_38.intermediate.current[-1].type.d.ptr = pcVar3;
    qVar4 = pTVar8[-1].type.d.size;
    pTVar8[-1].type.d.size = 0;
    local_38.intermediate.current[-1].type.d.size = qVar4;
    pDVar2 = pTVar8[-1].typeSuffix.d.d;
    pTVar8[-1].typeSuffix.d.d = (Data *)0x0;
    local_38.intermediate.current[-1].typeSuffix.d.d = pDVar2;
    pcVar3 = pTVar8[-1].typeSuffix.d.ptr;
    pTVar8[-1].typeSuffix.d.ptr = (char16_t *)0x0;
    local_38.intermediate.current[-1].typeSuffix.d.ptr = pcVar3;
    qVar4 = pTVar8[-1].typeSuffix.d.size;
    pTVar8[-1].typeSuffix.d.size = 0;
    local_38.intermediate.current[-1].typeSuffix.d.size = qVar4;
    ((d_first.current)->name).d.d =
         (Data *)&((d_first.current)->name).d.d[-5].super_QArrayData.alloc;
    pTVar8 = (TypedName *)&((first.current)->name).d.d[-5].super_QArrayData.alloc;
    ((first.current)->name).d.d = (Data *)pTVar8;
    local_38.intermediate.current = (TypedName *)((d_first.current)->name).d.d;
  }
  local_38.iter = &local_38.end;
  pTVar6 = local_38.intermediate.current;
  while (pTVar6 != pTVar1) {
    pDVar2 = pTVar6[-1].name.d.d;
    pTVar6[-1].name.d.d = pTVar8[-1].name.d.d;
    pTVar8[-1].name.d.d = pDVar2;
    pcVar3 = pTVar6[-1].name.d.ptr;
    pTVar6[-1].name.d.ptr = pTVar8[-1].name.d.ptr;
    pTVar8[-1].name.d.ptr = pcVar3;
    qVar4 = pTVar6[-1].name.d.size;
    pTVar6[-1].name.d.size = pTVar8[-1].name.d.size;
    pTVar8[-1].name.d.size = qVar4;
    pDVar2 = pTVar6[-1].type.d.d;
    pTVar6[-1].type.d.d = pTVar8[-1].type.d.d;
    pTVar8[-1].type.d.d = pDVar2;
    pcVar3 = pTVar6[-1].type.d.ptr;
    pTVar6[-1].type.d.ptr = pTVar8[-1].type.d.ptr;
    pTVar8[-1].type.d.ptr = pcVar3;
    qVar4 = pTVar6[-1].type.d.size;
    pTVar6[-1].type.d.size = pTVar8[-1].type.d.size;
    pTVar8[-1].type.d.size = qVar4;
    pDVar2 = pTVar6[-1].typeSuffix.d.d;
    pTVar6[-1].typeSuffix.d.d = pTVar8[-1].typeSuffix.d.d;
    pTVar8[-1].typeSuffix.d.d = pDVar2;
    pcVar3 = pTVar6[-1].typeSuffix.d.ptr;
    pTVar6[-1].typeSuffix.d.ptr = pTVar8[-1].typeSuffix.d.ptr;
    pTVar8[-1].typeSuffix.d.ptr = pcVar3;
    qVar4 = pTVar6[-1].typeSuffix.d.size;
    pTVar6[-1].typeSuffix.d.size = pTVar8[-1].typeSuffix.d.size;
    pTVar8[-1].typeSuffix.d.size = qVar4;
    ((d_first.current)->name).d.d =
         (Data *)&((d_first.current)->name).d.d[-5].super_QArrayData.alloc;
    pTVar8 = (TypedName *)&((first.current)->name).d.d[-5].super_QArrayData.alloc;
    ((first.current)->name).d.d = (Data *)pTVar8;
    pTVar6 = (TypedName *)((d_first.current)->name).d.d;
  }
  while (pTVar8 != pTVar7) {
    ((first.current)->name).d.d = (Data *)(pTVar8 + 1);
    pDVar2 = (pTVar8->typeSuffix).d.d;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&((pTVar8->typeSuffix).d.d)->super_QArrayData,2,0x10);
      }
    }
    pDVar2 = (pTVar8->type).d.d;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&((pTVar8->type).d.d)->super_QArrayData,2,0x10);
      }
    }
    piVar5 = *(int **)&(pTVar8->name).d.d;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        QArrayData::deallocate(*(QArrayData **)&(pTVar8->name).d.d,2,0x10);
      }
    }
    pTVar8 = (TypedName *)((first.current)->name).d.d;
  }
  q_relocate_overlap_n_left_move<std::reverse_iterator<VkSpecParser::TypedName_*>,_long_long>::
  Destructor::~Destructor(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}